

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

void __thiscall
TestSuite::doTest<bool,int(*)(bool)>
          (TestSuite *this,string *test_name,_func_int_bool *func,TestRange<bool> *range)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *psVar2;
  TestSuite **ppTVar3;
  code *in_RDX;
  TestRange<bool> *in_RSI;
  TestSuite *in_RDI;
  int ret;
  bool cur_arg;
  stringstream ss;
  int in_stack_00000214;
  string *in_stack_00000218;
  TestSuite *in_stack_00000220;
  string actual_test_name;
  size_t i;
  size_t n;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  TestSuite *in_stack_fffffffffffffd88;
  TestSuite *this_00;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  TestRange<bool> *in_stack_fffffffffffffdb8;
  string local_228 [32];
  string local_208 [35];
  byte local_1e5;
  stringstream local_1d8 [16];
  undefined1 local_1c8 [376];
  string local_50 [32];
  TestSuite *local_30;
  TestSuite *local_28;
  code *local_18;
  
  local_18 = in_RDX;
  bVar1 = matchFilter(in_stack_fffffffffffffd88,
                      (string *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  if (bVar1) {
    if ((in_RDI->useGivenRange & 1U) == 0) {
      this_00 = (TestSuite *)TestRange<bool>::getSteps(in_RSI);
    }
    else {
      this_00 = (TestSuite *)0x1;
    }
    local_28 = this_00;
    for (local_30 = (TestSuite *)0x0; local_30 < local_28;
        local_30 = (TestSuite *)&(local_30->options).abortOnFailure) {
      std::__cxx11::string::string(local_50,(string *)in_RSI);
      std::__cxx11::stringstream::stringstream(local_1d8);
      if ((in_RDI->useGivenRange & 1U) == 0) {
        bVar1 = TestRange<bool>::getEntry
                          (in_stack_fffffffffffffdb8,
                           CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
        in_stack_fffffffffffffd84 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd84);
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)bVar1;
      }
      else {
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_RDI->givenRange;
      }
      local_1e5 = __lhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      std::ostream::operator<<(local_1c8,(bool)local_1e5);
      std::__cxx11::stringstream::str();
      std::operator+((char *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
      std::operator+(__lhs,(char *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
      std::__cxx11::string::operator+=(local_50,local_208);
      std::__cxx11::string::~string(local_208);
      std::__cxx11::string::~string(local_228);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb8);
      readyTest(this_00,__lhs);
      psVar2 = getResMsg_abi_cxx11_();
      std::__cxx11::string::operator=((string *)psVar2,"");
      psVar2 = getInfoMsg_abi_cxx11_();
      std::__cxx11::string::operator=((string *)psVar2,"");
      ppTVar3 = getCurTest();
      *ppTVar3 = in_RDI;
      in_stack_fffffffffffffd80 = (*local_18)(local_1e5 & 1);
      in_stack_fffffffffffffdb4 = in_stack_fffffffffffffd80;
      reportTestResult(in_stack_00000220,in_stack_00000218,in_stack_00000214);
      std::__cxx11::stringstream::~stringstream(local_1d8);
      std::__cxx11::string::~string(local_50);
    }
  }
  return;
}

Assistant:

void doTest( std::string test_name,
                 F func,
                 TestRange<T> range )
    {
        if (!matchFilter(test_name)) return;

        size_t n = (useGivenRange) ? 1 : range.getSteps();
        size_t i;

        for (i=0; i<n; ++i) {
            std::string actual_test_name = test_name;
            std::stringstream ss;


            T cur_arg = (useGivenRange)
                        ? givenRange
                        : range.getEntry(i);

            ss << cur_arg;
            actual_test_name += " (" + ss.str() + ")";
            readyTest(actual_test_name);

            TestSuite::getResMsg() = "";
            TestSuite::getInfoMsg() = "";
            TestSuite::getCurTest() = this;

            int ret = func(cur_arg);
            reportTestResult(actual_test_name, ret);
        }
    }